

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_CustomComboAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  int iVar2;
  PClass *pPVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  AActor *pAVar8;
  PClassActor *pPVar9;
  AActor *self;
  char *pcVar10;
  int iVar11;
  int iVar12;
  PClassActor *type;
  bool bVar13;
  double dVar14;
  FName local_60;
  FSoundID local_5c;
  DVector3 local_58;
  DAngle local_38;
  PClass *pPVar7;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_003cd046;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003cd02d:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003cd046:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6ce,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003ccd35;
    pPVar7 = (self->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar5 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar5);
      (self->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar13 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar3 && bVar13) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar13 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar3) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar13) {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003cd046;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003cd02d;
LAB_003ccd35:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_003cd065;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003cd036:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003cd065:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6cf,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003ccd94;
    pPVar9 = type;
    if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar9 = (PClassActor *)(pPVar9->super_PClass).ParentClass;
        if (pPVar9 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar9 != (PClassActor *)0x0);
      if (pPVar9 == (PClassActor *)0x0) {
        pcVar10 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_003cd065;
      }
    }
    bVar13 = false;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003cd036;
LAB_003ccd94:
    bVar13 = true;
    type = (PClassActor *)0x0;
  }
  if (numparam < 3) {
    pcVar10 = "(paramnum) < numparam";
LAB_003cd08d:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6d0,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar10 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003cd08d;
  }
  if (numparam == 3) {
    pcVar10 = "(paramnum) < numparam";
LAB_003cd0b5:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6d1,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar10 = "param[paramnum].Type == REGT_INT";
    goto LAB_003cd0b5;
  }
  dVar1 = param[2].field_0.f;
  iVar5 = param[3].field_0.i;
  if ((uint)numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003cd105;
    }
    iVar6 = param[4].field_0.i;
LAB_003ccdff:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cd124:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6d3,
                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar11 = param[5].field_0.i;
LAB_003cce0e:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cd0d4:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6d4,
                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003cd105:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6d2,
                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[4].field_0.i;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003ccdff;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cd124;
    }
    iVar11 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003cce0e;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cd0d4;
    }
  }
  pAVar8 = (self->target).field_0.p;
  if (pAVar8 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  iVar2 = param[6].field_0.i;
  A_FaceTarget(self);
  bVar4 = AActor::CheckMeleeRange(self);
  if (!bVar4) {
    if (bVar13) {
      return 0;
    }
    dVar14 = AActor::GetBobOffset(self,0.0);
    dVar1 = dVar1 + dVar14 + -32.0;
    local_58.Z = (self->__Pos).Z + dVar1;
    (self->__Pos).Z = local_58.Z;
    local_58.Z = local_58.Z + 32.0;
    local_58.X = (self->__Pos).X;
    local_58.Y = (self->__Pos).Y;
    pAVar8 = (self->target).field_0.p;
    if (pAVar8 != (AActor *)0x0) {
      if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003ccfca;
      (self->target).field_0.p = (AActor *)0x0;
    }
    pAVar8 = (AActor *)0x0;
LAB_003ccfca:
    pAVar8 = P_SpawnMissileXYZ(&local_58,self,pAVar8,type,false,(AActor *)0x0);
    (self->__Pos).Z = (self->__Pos).Z - dVar1;
    if (pAVar8 == (AActor *)0x0) {
      return 0;
    }
    if (((pAVar8->flags2).Value & 0x40000000) != 0) {
      (pAVar8->tracer).field_0 = (self->target).field_0;
    }
    P_CheckMissileSpawn(pAVar8,self->radius);
    return 0;
  }
  iVar12 = 0x89;
  if (iVar11 != 0) {
    iVar12 = iVar11;
  }
  if (iVar6 != 0) {
    local_5c.ID = iVar6;
    S_Sound(self,1,&local_5c,1.0,1.0);
  }
  pAVar8 = (self->target).field_0.p;
  if (pAVar8 == (AActor *)0x0) {
LAB_003cceae:
    pAVar8 = (AActor *)0x0;
  }
  else if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    goto LAB_003cceae;
  }
  local_38.Degrees = 0.0;
  local_60.Index = iVar12;
  iVar6 = P_DamageMobj(pAVar8,self,self,iVar5,&local_60,0,&local_38);
  if (iVar2 == 0) {
    return 0;
  }
  if (0 < iVar6) {
    iVar5 = iVar6;
  }
  pAVar8 = (self->target).field_0.p;
  if (pAVar8 != (AActor *)0x0) {
    if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003ccf06;
    (self->target).field_0.p = (AActor *)0x0;
  }
  pAVar8 = (AActor *)0x0;
LAB_003ccf06:
  P_TraceBleed(iVar5,pAVar8,self);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomComboAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS		(ti, AActor);
	PARAM_FLOAT		(spawnheight);
	PARAM_INT		(damage);
	PARAM_SOUND_DEF	(meleesound);
	PARAM_NAME_DEF	(damagetype);
	PARAM_BOOL_DEF	(bleed);

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange())
	{
		if (damagetype == NAME_None)
			damagetype = NAME_Melee;	// Melee is the default type
		if (meleesound)
			S_Sound (self, CHAN_WEAPON, meleesound, 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, damagetype);
		if (bleed)
			P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	else if (ti) 
	{
		// This seemingly senseless code is needed for proper aiming.
		double add = spawnheight + self->GetBobOffset() - 32;
		self->AddZ(add);
		AActor *missile = P_SpawnMissileXYZ (self->PosPlusZ(32.), self, self->target, ti, false);
		self->AddZ(-add);

		if (missile)
		{
			// automatic handling of seeker missiles
			if (missile->flags2 & MF2_SEEKERMISSILE)
			{
				missile->tracer = self->target;
			}
			P_CheckMissileSpawn(missile, self->radius);
		}
	}
	return 0;
}